

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomControlPdu.cpp
# Opt level: O0

bool __thiscall
DIS::IntercomControlPdu::operator==(IntercomControlPdu *this,IntercomControlPdu *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  ulong local_28;
  size_t idx;
  bool ivarsEqual;
  IntercomControlPdu *rhs_local;
  IntercomControlPdu *this_local;
  
  idx._7_1_ = RadioCommunicationsFamilyPdu::operator==
                        (&this->super_RadioCommunicationsFamilyPdu,
                         &rhs->super_RadioCommunicationsFamilyPdu);
  if ((this->super_RadioCommunicationsFamilyPdu).field_0x2a !=
      (rhs->super_RadioCommunicationsFamilyPdu).field_0x2a) {
    idx._7_1_ = false;
  }
  if ((this->super_RadioCommunicationsFamilyPdu).field_0x2b !=
      (rhs->super_RadioCommunicationsFamilyPdu).field_0x2b) {
    idx._7_1_ = false;
  }
  bVar1 = EntityID::operator==(&this->_sourceEntityID,&rhs->_sourceEntityID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_sourceCommunicationsDeviceID != rhs->_sourceCommunicationsDeviceID) {
    idx._7_1_ = false;
  }
  if (this->_sourceLineID != rhs->_sourceLineID) {
    idx._7_1_ = false;
  }
  if (this->_transmitPriority != rhs->_transmitPriority) {
    idx._7_1_ = false;
  }
  if (this->_transmitLineState != rhs->_transmitLineState) {
    idx._7_1_ = false;
  }
  if (this->_command != rhs->_command) {
    idx._7_1_ = false;
  }
  bVar1 = EntityID::operator==(&this->_masterEntityID,&rhs->_masterEntityID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_masterCommunicationsDeviceID != rhs->_masterCommunicationsDeviceID) {
    idx._7_1_ = false;
  }
  local_28 = 0;
  while( true ) {
    sVar2 = std::
            vector<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
            ::size(&this->_intercomParameters);
    if (sVar2 <= local_28) break;
    this_00 = std::
              vector<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
              ::operator[](&this->_intercomParameters,local_28);
    rhs_00 = std::
             vector<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
             ::operator[](&rhs->_intercomParameters,local_28);
    bVar1 = IntercomCommunicationsParameters::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_28 = local_28 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool IntercomControlPdu::operator ==(const IntercomControlPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = RadioCommunicationsFamilyPdu::operator==(rhs);

     if( ! (_controlType == rhs._controlType) ) ivarsEqual = false;
     if( ! (_communicationsChannelType == rhs._communicationsChannelType) ) ivarsEqual = false;
     if( ! (_sourceEntityID == rhs._sourceEntityID) ) ivarsEqual = false;
     if( ! (_sourceCommunicationsDeviceID == rhs._sourceCommunicationsDeviceID) ) ivarsEqual = false;
     if( ! (_sourceLineID == rhs._sourceLineID) ) ivarsEqual = false;
     if( ! (_transmitPriority == rhs._transmitPriority) ) ivarsEqual = false;
     if( ! (_transmitLineState == rhs._transmitLineState) ) ivarsEqual = false;
     if( ! (_command == rhs._command) ) ivarsEqual = false;
     if( ! (_masterEntityID == rhs._masterEntityID) ) ivarsEqual = false;
     if( ! (_masterCommunicationsDeviceID == rhs._masterCommunicationsDeviceID) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _intercomParameters.size(); idx++)
     {
        if( ! ( _intercomParameters[idx] == rhs._intercomParameters[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }